

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O0

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::update(ExponentiallyDecayingReservoir *this,long value)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  uniform_real_distribution<double> *this_00;
  random_device *__urng;
  atomic_long *paVar3;
  mapped_type *this_01;
  double dVar4;
  result_type_conflict rVar5;
  __enable_if_t<is_constructible<value_type,_pair<double,_WeightedSample>_>::value,_pair<iterator,_bool>_>
  _Var6;
  bool did_insert;
  WeightedSample local_e0;
  pair<double,_cppmetrics::WeightedSample> local_d0;
  _Base_ptr local_b8;
  __enable_if_t<is_constructible<value_type,_pair<double,_WeightedSample>_>::value,_pair<iterator,_bool>_>
  insert_result;
  double smallest_priority;
  reference local_98;
  pair<const_double,_cppmetrics::WeightedSample> *smallest_pair;
  ulong local_80;
  __int_type new_size;
  double priority;
  double item_weight;
  time_t scale_factor;
  long local_50;
  time_t now;
  lock_guard<std::mutex> lock;
  long value_local;
  ExponentiallyDecayingReservoir *this_local;
  
  lock._M_device = (mutex_type *)value;
  rescale_if_needed(this);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&now,&this->m_mutex);
  iVar2 = (*this->m_clock->_vptr_Clock[1])();
  local_50 = CONCAT44(extraout_var,iVar2);
  item_weight = (double)(local_50 - this->m_start);
  dVar4 = exp(this->m_alpha * (double)(long)item_weight);
  priority = dVar4;
  this_00 = (uniform_real_distribution<double> *)(anonymous)::dist();
  __urng = (random_device *)(anonymous)::rd();
  rVar5 = std::uniform_real_distribution<double>::operator()(this_00,__urng);
  new_size = (__int_type)(dVar4 / rVar5);
  paVar3 = &this->m_count;
  LOCK();
  lVar1 = (paVar3->super___atomic_base<long>)._M_i;
  (paVar3->super___atomic_base<long>)._M_i = (paVar3->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_80 = lVar1 + 1;
  if (this->m_size < local_80) {
    smallest_priority =
         (double)std::
                 map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                 ::begin(&this->m_samples);
    local_98 = std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>::
               operator*((_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_> *)
                         &smallest_priority);
    insert_result._8_8_ = local_98->first;
    if ((double)insert_result._8_8_ < (double)new_size) {
      WeightedSample::WeightedSample(&local_e0,(long)lock._M_device,priority);
      std::make_pair<double&,cppmetrics::WeightedSample>(&local_d0,(double *)&new_size,&local_e0);
      _Var6 = std::
              map<double,cppmetrics::WeightedSample,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
              ::insert<std::pair<double,cppmetrics::WeightedSample>>
                        ((map<double,cppmetrics::WeightedSample,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                          *)&this->m_samples,&local_d0);
      local_b8 = (_Base_ptr)_Var6.first._M_node;
      insert_result.first._M_node._0_1_ = _Var6.second;
      if (((undefined1  [16])_Var6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::
        map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
        ::erase(&this->m_samples,(key_type *)&insert_result.second);
      }
    }
  }
  else {
    WeightedSample::WeightedSample((WeightedSample *)&smallest_pair,(long)lock._M_device,priority);
    this_01 = std::
              map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
              ::operator[](&this->m_samples,(key_type *)&new_size);
    WeightedSample::operator=(this_01,(WeightedSample *)&smallest_pair);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&now);
  return;
}

Assistant:

void ExponentiallyDecayingReservoir::update(long value)
{
  rescale_if_needed();

  std::lock_guard<std::mutex> lock(m_mutex);

  auto now = m_clock->now_as_time_t();
  auto scale_factor = now - m_start;
  double item_weight = std::exp(m_alpha * scale_factor);
  double priority = item_weight / dist(rd);
  
  auto new_size = m_count.fetch_add(1) + 1;
  if (new_size <= m_size)
  {
    m_samples[priority] = WeightedSample{value, item_weight};
  }
  else
  {
    const auto& smallest_pair = *m_samples.begin();
    double smallest_priority = smallest_pair.first;
    if (smallest_priority < priority)
    {
      auto insert_result = m_samples.insert(std::make_pair(priority, WeightedSample{value, item_weight}));
      bool did_insert = insert_result.second;
      if (did_insert)
      {
        m_samples.erase(smallest_priority);
      }
    }
  }
}